

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_parser.cc
# Opt level: O3

void __thiscall
iqxmlrpc::anon_unknown_7::StructBuilder::do_visit_element(StructBuilder *this,string *tagname)

{
  int iVar1;
  Value_type *pVVar2;
  XML_RPC_violation *this_00;
  string local_40;
  
  iVar1 = StateMachine::change(&this->state_,tagname);
  if (iVar1 == 1) {
    return;
  }
  if (iVar1 == 3) {
    pVVar2 = BuilderBase::sub_build<iqxmlrpc::Value_type*,iqxmlrpc::ValueBuilder>
                       ((BuilderBase *)this,false);
    this->value_ = pVVar2;
    if (pVVar2 != (Value_type *)0x0) {
      return;
    }
    pVVar2 = (Value_type *)operator_new(0x28);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
    pVVar2->_vptr_Value_type = (_func_int **)&PTR__Scalar_0018acb8;
    pVVar2[1]._vptr_Value_type = (_func_int **)(pVVar2 + 3);
    std::__cxx11::string::_M_construct<char*>
              ((string *)(pVVar2 + 1),local_40._M_dataplus._M_p,
               local_40._M_dataplus._M_p + local_40._M_string_length);
    this->value_ = pVVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p == &local_40.field_2) {
      return;
    }
  }
  else {
    if (iVar1 != 2) {
      this_00 = (XML_RPC_violation *)__cxa_allocate_exception(0x18);
      Parser::context_abi_cxx11_(&local_40,(this->super_ValueBuilderBase).super_BuilderBase.parser_)
      ;
      XML_RPC_violation::XML_RPC_violation(this_00,&local_40);
      __cxa_throw(this_00,&XML_RPC_violation::typeinfo,std::runtime_error::~runtime_error);
    }
    Parser::get_data_abi_cxx11_(&local_40,(this->super_ValueBuilderBase).super_BuilderBase.parser_);
    std::__cxx11::string::operator=((string *)&this->name_,(string *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p == &local_40.field_2) {
      return;
    }
  }
  operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

virtual void
  do_visit_element(const std::string& tagname)
  {
    switch (state_.change(tagname)) {
    case NAME_READ:
      name_ = parser_.get_data();
      break;

    case VALUE_READ:
      value_ = sub_build<Value_type*, ValueBuilder>();
      value_ = value_ ? value_ : new String("");
      break;

    case MEMBER:
      break;

    default:
      throw XML_RPC_violation(parser_.context());
    }
  }